

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

void Gia_ManConvertPackingToEdges(Gia_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  Vec_Int_t *pVVar7;
  int *__s_00;
  uint *puVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint *puVar17;
  int iVar18;
  int nNodes [4];
  int *local_60;
  uint local_48 [6];
  
  if (p->vPacking == (Vec_Int_t *)0x0) {
    return;
  }
  pVVar6 = p->vEdge1;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      p->vEdge1->pArray = (int *)0x0;
      pVVar6 = p->vEdge1;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_001f6fb2;
    }
    free(pVVar6);
    p->vEdge1 = (Vec_Int_t *)0x0;
  }
LAB_001f6fb2:
  pVVar6 = p->vEdge2;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      p->vEdge2->pArray = (int *)0x0;
      pVVar6 = p->vEdge2;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_001f6ffe;
    }
    free(pVVar6);
    p->vEdge2 = (Vec_Int_t *)0x0;
  }
LAB_001f6ffe:
  iVar16 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar18 = iVar16;
  }
  pVVar6->nCap = iVar18;
  if (iVar18 == 0) {
    __s_00 = (int *)0x0;
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar16;
    p->vEdge1 = pVVar6;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    local_60 = &pVVar7->nSize;
    pVVar7->nCap = 0;
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar16;
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar18 << 2);
    pVVar6->pArray = __s;
    pVVar6->nSize = iVar16;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar16 * 4);
    }
    p->vEdge1 = pVVar6;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    local_60 = &pVVar7->nSize;
    pVVar7->nCap = iVar18;
    __s_00 = (int *)malloc((long)iVar18 << 2);
    pVVar7->pArray = __s_00;
    pVVar7->nSize = iVar16;
    if (__s_00 == (int *)0x0) {
      __s_00 = (int *)0x0;
    }
    else {
      memset(__s_00,0,(long)iVar16 << 2);
    }
  }
  p->vEdge2 = pVVar7;
  pVVar7 = p->vPacking;
  iVar16 = pVVar7->nSize;
  if (0 < iVar16) {
    piVar2 = pVVar7->pArray;
    iVar18 = *piVar2;
    if (iVar16 == 1) {
      if (iVar18 == 0) {
        return;
      }
    }
    else {
      uVar12 = 1;
      iVar10 = 0;
      iVar13 = 0;
      do {
        uVar1 = piVar2[uVar12 & 0xffffffff];
        if (2 < uVar1 - 1) {
          __assert_fail("Entry > 0 && Entry < 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                        ,0x84,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
        }
        uVar11 = (int)uVar12 + 1;
        uVar12 = 0;
        do {
          if (iVar16 <= (int)(uVar11 + (int)uVar12)) goto LAB_001f7397;
          local_48[uVar12] = piVar2[uVar11 + uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar1 != uVar12);
        if ((ulong)uVar1 == 3) {
          lVar14 = (long)(int)local_48[0];
          if ((lVar14 < 0) || (pVVar6->nSize <= (int)local_48[0])) goto LAB_001f7397;
          uVar15 = (ulong)local_48[2];
          piVar3 = __s;
          if (__s[lVar14] == 0) {
LAB_001f7262:
            piVar3[lVar14] = local_48[2];
            iVar16 = 0;
          }
          else {
            if (*local_60 <= (int)local_48[0]) goto LAB_001f7397;
            iVar16 = 1;
            piVar3 = __s_00;
            if (__s_00[lVar14] == 0) goto LAB_001f7262;
          }
          if (((int)local_48[2] < 0) || (pVVar6->nSize <= (int)local_48[2])) goto LAB_001f7397;
          puVar17 = (uint *)(__s + uVar15);
          puVar8 = puVar17;
          if (*puVar17 == 0) {
LAB_001f72a8:
            *puVar8 = local_48[0];
            iVar4 = 0;
          }
          else {
            if (*local_60 <= (int)local_48[2]) goto LAB_001f7397;
            iVar4 = 1;
            if (__s_00[uVar15] == 0) {
              puVar8 = (uint *)(__s_00 + uVar15);
              goto LAB_001f72a8;
            }
          }
          lVar14 = (long)(int)local_48[1];
          if ((lVar14 < 0) || (iVar5 = pVVar6->nSize, iVar5 <= (int)local_48[1])) goto LAB_001f7397;
          piVar3 = __s;
          if (__s[lVar14] == 0) {
LAB_001f7301:
            piVar3[lVar14] = local_48[2];
            iVar5 = pVVar6->nSize;
            iVar9 = 0;
          }
          else {
            if (*local_60 <= (int)local_48[1]) goto LAB_001f7397;
            iVar9 = 1;
            piVar3 = __s_00;
            if (__s_00[lVar14] == 0) goto LAB_001f7301;
          }
          if (iVar5 <= (int)local_48[2]) goto LAB_001f7397;
          if (*puVar17 == 0) {
LAB_001f7333:
            *puVar17 = local_48[1];
            iVar5 = 0;
          }
          else {
            if (*local_60 <= (int)local_48[2]) goto LAB_001f7397;
            iVar5 = 1;
            if (__s_00[uVar15] == 0) {
              puVar17 = (uint *)(__s_00 + uVar15);
              goto LAB_001f7333;
            }
          }
          iVar10 = iVar16 + iVar10 + iVar4 + iVar9 + iVar5;
        }
        else if (uVar1 == 2) {
          lVar14 = (long)(int)local_48[0];
          if ((lVar14 < 0) || (pVVar6->nSize <= (int)local_48[0])) goto LAB_001f7397;
          uVar15 = (ulong)local_48[1];
          piVar3 = __s;
          if (__s[lVar14] == 0) {
LAB_001f7214:
            piVar3[lVar14] = local_48[1];
            iVar16 = 0;
          }
          else {
            if (*local_60 <= (int)local_48[0]) goto LAB_001f7397;
            iVar16 = 1;
            piVar3 = __s_00;
            if (__s_00[lVar14] == 0) goto LAB_001f7214;
          }
          if (((int)local_48[1] < 0) || (pVVar6->nSize <= (int)local_48[1])) goto LAB_001f7397;
          piVar3 = __s;
          if (__s[uVar15] == 0) {
LAB_001f72f0:
            piVar3[uVar15] = local_48[0];
            iVar4 = 0;
          }
          else {
            if (*local_60 <= (int)local_48[1]) goto LAB_001f7397;
            iVar4 = 1;
            piVar3 = __s_00;
            if (__s_00[uVar15] == 0) goto LAB_001f72f0;
          }
          iVar10 = iVar16 + iVar10 + iVar4;
        }
        uVar12 = uVar11 + uVar12;
        iVar13 = iVar13 + 1;
        iVar16 = pVVar7->nSize;
      } while ((int)uVar12 < iVar16);
      if (iVar18 == iVar13) {
        if (iVar10 == 0) {
          return;
        }
        printf("Skipped %d illegal edges.\n");
        return;
      }
    }
    __assert_fail("nEntries == nEntries2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x98,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
  }
LAB_001f7397:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManConvertPackingToEdges( Gia_Man_t * p )
{
    int i, k, Entry, nEntries, nEntries2, nNodes[4], Count = 0;
    if ( p->vPacking == NULL )
        return;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // iterate through structures
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
            nNodes[k] = Vec_IntEntry(p->vPacking, i);
        i--;
        nEntries2++;
        // create edges
        if ( Entry == 2 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[1], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[0], p->vEdge1, p->vEdge2 );
        }
        else if ( Entry == 3 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[0], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[1], p->vEdge1, p->vEdge2 );
        }
    }
    assert( nEntries == nEntries2 );
    if ( Count )
        printf( "Skipped %d illegal edges.\n", Count );
}